

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O1

void __thiscall FString::FString(FString *this,char oneChar)

{
  FStringData *pFVar1;
  
  if (oneChar == '\0') {
    NullString.RefCount = NullString.RefCount + 1;
    this->Chars = (char *)0x727dbc;
  }
  else {
    pFVar1 = FStringData::Alloc(1);
    this->Chars = (char *)(pFVar1 + 1);
    pFVar1->Len = 1;
    *(char *)&pFVar1[1].Len = oneChar;
    *(undefined1 *)((long)&pFVar1[1].Len + 1) = 0;
  }
  return;
}

Assistant:

FString::FString (char oneChar)
{
	if (oneChar == '\0')
	{
		NullString.RefCount++;
		Chars = &NullString.Nothing[0];
	}
	else
	{
		AllocBuffer (1);
		Chars[0] = oneChar;
		Chars[1] = '\0';
	}
}